

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Collections.cpp
# Opt level: O3

int Lodtalk::MethodDictionary::stAtPut(InterpreterProxy *interpreter)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Oop key;
  Oop value;
  undefined4 extraout_var_03;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1a])();
  if (CONCAT44(extraout_var,iVar1) == 2) {
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0xb])(interpreter);
    key.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,0);
    key.field_0.uintValue._4_4_ = extraout_var_01;
    value.field_0._0_4_ = (*interpreter->_vptr_InterpreterProxy[0x1c])(interpreter,1);
    value.field_0.uintValue._4_4_ = extraout_var_02;
    iVar2 = (**interpreter->_vptr_InterpreterProxy)(interpreter);
    internalAtPut((MethodDictionary *)CONCAT44(extraout_var_00,iVar1),
                  (VMContext *)CONCAT44(extraout_var_03,iVar2),key,value);
    iVar1 = (*interpreter->_vptr_InterpreterProxy[0x17])(interpreter,value.field_0);
    return iVar1;
  }
  iVar1 = (*interpreter->_vptr_InterpreterProxy[0x1e])(interpreter);
  return iVar1;
}

Assistant:

int MethodDictionary::stAtPut(InterpreterProxy *interpreter)
{
    if(interpreter->getArgumentCount() != 2)
        return interpreter->primitiveFailed();

    Oop selfOop = interpreter->getReceiver();
    Oop key = interpreter->getTemporary(0);
    Oop value = interpreter->getTemporary(1);
    auto self = reinterpret_cast<MethodDictionary*> (selfOop.pointer);
    return interpreter->returnOop(self->atPut(interpreter->getContext(), key, value));
}